

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

void __thiscall VcprojGenerator::initConfiguration(VcprojGenerator *this)

{
  Target TVar1;
  bool bVar2;
  byte bVar3;
  short sVar4;
  short sVar5;
  DotNET DVar6;
  VcprojGenerator *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<char,_const_QString_&> QVar7;
  bool isDebug;
  VCConfiguration *conf;
  QString targetSuffix;
  QFileInfo targetInfo;
  ProString temp;
  ProString *in_stack_fffffffffffff8e8;
  QMakeProject *str;
  QMakeProject *in_stack_fffffffffffff8f0;
  int iVar8;
  QMakeProject *this_00;
  QMakeProject *in_stack_fffffffffffff8f8;
  QMakeProject *ok;
  ProString *in_stack_fffffffffffff900;
  VcprojGenerator *this_01;
  undefined6 in_stack_fffffffffffff908;
  undefined2 in_stack_fffffffffffff90e;
  VcprojGenerator *this_02;
  undefined6 in_stack_fffffffffffff918;
  undefined2 in_stack_fffffffffffff91e;
  MakefileGenerator *in_stack_fffffffffffff920;
  VcprojGenerator *pVVar9;
  VcprojGenerator *in_stack_fffffffffffff928;
  VcprojGenerator *in_stack_fffffffffffff930;
  QString *in_stack_fffffffffffff948;
  VcprojGenerator *in_stack_fffffffffffff958;
  QString *pQVar10;
  VcprojGenerator *in_stack_fffffffffffff968;
  VcprojGenerator *in_stack_fffffffffffffa40;
  ProString local_3f0 [5];
  QChar local_2f2 [40];
  undefined1 local_2a1;
  char local_2a0;
  QString *local_298;
  undefined8 local_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 local_1d0 [4];
  QChar local_1aa;
  undefined1 local_1a8 [192];
  ProString local_e8 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pVVar9 = (VcprojGenerator *)(in_RDI->super_Win32MakefileGenerator).super_MakefileGenerator.project
  ;
  QString::QString((QString *)in_stack_fffffffffffff8f8,(char *)in_stack_fffffffffffff928);
  bVar2 = QMakeProject::isActiveConfig
                    (in_stack_fffffffffffff8f8,(QString *)in_stack_fffffffffffff8f0,
                     SUB81((ulong)in_stack_fffffffffffff8e8 >> 0x38,0));
  (in_RDI->vcProject).Configuration.suppressUnknownOptionWarnings = bVar2;
  QString::~QString((QString *)0x2919b5);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff8f0,(char *)in_stack_fffffffffffff8e8);
  QMakeEvaluator::first
            ((QMakeEvaluator *)CONCAT26(in_stack_fffffffffffff90e,in_stack_fffffffffffff908),
             (ProKey *)in_stack_fffffffffffff900);
  DVar6 = vsVersionFromString((ProString *)
                              CONCAT26(in_stack_fffffffffffff91e,in_stack_fffffffffffff918));
  (in_RDI->vcProject).Configuration.CompilerVersion = DVar6;
  ProString::~ProString((ProString *)0x291a24);
  ProKey::~ProKey((ProKey *)0x291a31);
  initCompilerTool(pVVar9);
  QString::QString((QString *)in_stack_fffffffffffff8f8,(char *)in_stack_fffffffffffff928);
  QMakeProject::isActiveConfig
            (in_stack_fffffffffffff8f8,(QString *)in_stack_fffffffffffff8f0,
             SUB81((ulong)in_stack_fffffffffffff8e8 >> 0x38,0));
  QString::~QString((QString *)0x291a94);
  if (in_RDI->projectTarget == StaticLib) {
    initLibrarianTool(in_stack_fffffffffffff928);
  }
  else {
    QString::QString((QString *)in_stack_fffffffffffff8f8,(char *)in_stack_fffffffffffff928);
    bVar2 = QMakeProject::isActiveConfig
                      (in_stack_fffffffffffff8f8,(QString *)in_stack_fffffffffffff8f0,
                       SUB81((ulong)in_stack_fffffffffffff8e8 >> 0x38,0));
    (in_RDI->vcProject).Configuration.linker.GenerateDebugInformation = (uint)bVar2;
    QString::~QString((QString *)0x291b31);
    initLinkerTool(in_stack_fffffffffffff968);
  }
  initManifestTool(in_stack_fffffffffffff930);
  initResourceTool(in_stack_fffffffffffff958);
  initIDLTool(in_RDI);
  local_e8[0].m_file = -0x55555556;
  local_e8[0]._36_4_ = 0xaaaaaaaa;
  local_e8[0].m_hash = 0xaaaaaaaaaaaaaaaa;
  local_e8[0].m_string.d.size = -0x5555555555555556;
  local_e8[0].m_offset = -0x55555556;
  local_e8[0].m_length = -0x55555556;
  local_e8[0].m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_e8[0].m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff8f0,(char *)in_stack_fffffffffffff8e8);
  QMakeEvaluator::first
            ((QMakeEvaluator *)CONCAT26(in_stack_fffffffffffff90e,in_stack_fffffffffffff908),
             (ProKey *)in_stack_fffffffffffff900);
  ProKey::~ProKey((ProKey *)0x291be1);
  TVar1 = in_RDI->projectTarget;
  if (TVar1 != Application) {
    if (TVar1 == SharedLib) {
      (in_RDI->vcProject).Configuration.ConfigurationType = typeDynamicLibrary;
      goto LAB_00291c4b;
    }
    if (TVar1 == StaticLib) {
      (in_RDI->vcProject).Configuration.ConfigurationType = typeStaticLibrary;
      goto LAB_00291c4b;
    }
  }
  (in_RDI->vcProject).Configuration.ConfigurationType = typeApplication;
LAB_00291c4b:
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff8f0,(char *)in_stack_fffffffffffff8e8);
  QMakeEvaluator::first
            ((QMakeEvaluator *)CONCAT26(in_stack_fffffffffffff90e,in_stack_fffffffffffff908),
             (ProKey *)in_stack_fffffffffffff900);
  ProString::toQString(in_stack_fffffffffffff8e8);
  QString::operator=((QString *)in_stack_fffffffffffff8f0,&in_stack_fffffffffffff8e8->m_string);
  QString::~QString((QString *)0x291cd1);
  ProString::~ProString((ProString *)0x291cde);
  ProKey::~ProKey((ProKey *)0x291ceb);
  bVar2 = QString::isEmpty((QString *)0x291cff);
  if (bVar2) {
    QString::operator=((QString *)in_stack_fffffffffffff8f8,
                       (char *)CONCAT26(in_stack_fffffffffffff91e,in_stack_fffffffffffff918));
  }
  pQVar10 = &(in_RDI->vcProject).Configuration.OutputDirectory;
  QString::QString((QString *)in_stack_fffffffffffff8f8,(char *)in_stack_fffffffffffff928);
  bVar3 = QString::endsWith((QString *)pQVar10,(CaseSensitivity)local_1a8);
  QString::~QString((QString *)0x291d71);
  if (((bVar3 ^ 0xff) & 1) != 0) {
    QChar::QChar<char,_true>(&local_1aa,'\\');
    QString::operator+=((QString *)in_stack_fffffffffffff8f0,
                        (QChar)(char16_t)((ulong)in_stack_fffffffffffff8f8 >> 0x30));
  }
  if (0x9f < (int)(in_RDI->vcProject).Configuration.CompilerVersion) {
    retrievePlatformToolSet
              ((VcprojGenerator *)CONCAT26(in_stack_fffffffffffff90e,in_stack_fffffffffffff908));
    QString::operator=((QString *)in_stack_fffffffffffff8f0,&in_stack_fffffffffffff8e8->m_string);
    QString::~QString((QString *)0x291dfc);
    local_1d0[0] = 0xaaaaaaaaaaaaaaaa;
    pVVar9 = (VcprojGenerator *)
             (in_RDI->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff8f0,(char *)in_stack_fffffffffffff8e8);
    QMakeEvaluator::first
              ((QMakeEvaluator *)CONCAT26(in_stack_fffffffffffff90e,in_stack_fffffffffffff908),
               (ProKey *)in_stack_fffffffffffff900);
    ProString::toQString(in_stack_fffffffffffff8e8);
    MakefileGenerator::fileInfo
              (in_stack_fffffffffffff920,
               (QString *)CONCAT26(in_stack_fffffffffffff91e,in_stack_fffffffffffff918));
    QString::~QString((QString *)0x291e8c);
    ProString::~ProString((ProString *)0x291e99);
    ProKey::~ProKey((ProKey *)0x291ea6);
    QFileInfo::completeBaseName();
    QString::operator=((QString *)in_stack_fffffffffffff8f0,&in_stack_fffffffffffff8e8->m_string);
    QString::~QString((QString *)0x291ee4);
    local_278 = 0xaaaaaaaaaaaaaaaa;
    local_270 = 0xaaaaaaaaaaaaaaaa;
    local_268 = 0xaaaaaaaaaaaaaaaa;
    QFileInfo::suffix();
    bVar2 = isStandardSuffix(pVVar9,in_stack_fffffffffffff948);
    if (!bVar2) {
      local_2a1 = 0x2e;
      QVar7 = ::operator+((char *)in_stack_fffffffffffff8f0,&in_stack_fffffffffffff8e8->m_string);
      local_298 = QVar7.b;
      local_2a0 = QVar7.a;
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<char,_const_QString_&> *)in_stack_fffffffffffff8e8);
      QString::operator=((QString *)in_stack_fffffffffffff8f0,&in_stack_fffffffffffff8e8->m_string);
      QString::~QString((QString *)0x291fa9);
    }
    QString::~QString((QString *)0x291fb6);
    QFileInfo::~QFileInfo((QFileInfo *)local_1d0);
  }
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff8f0,(char *)in_stack_fffffffffffff8e8);
  QMakeProject::values(in_stack_fffffffffffff8f0,(ProKey *)in_stack_fffffffffffff8e8);
  QChar::QChar<char,_true>(local_2f2,' ');
  ProStringList::join((ProStringList *)in_stack_fffffffffffff8e8,
                      (QChar)(char16_t)((ulong)in_stack_fffffffffffff8f8 >> 0x30));
  QString::operator=((QString *)in_stack_fffffffffffff8f0,&in_stack_fffffffffffff8e8->m_string);
  QString::~QString((QString *)0x292054);
  ProKey::~ProKey((ProKey *)0x292061);
  bVar2 = QString::isEmpty((QString *)0x292072);
  if (bVar2) {
    QString::operator=((QString *)in_stack_fffffffffffff8f8,
                       (char *)CONCAT26(in_stack_fffffffffffff91e,in_stack_fffffffffffff918));
  }
  QString::operator=(&(in_RDI->vcProject).Configuration.ConfigurationName,
                     (QString *)&(in_RDI->vcProject).Configuration.Name);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff8f0,(char *)in_stack_fffffffffffff8e8);
  bVar2 = QMakeProject::isEmpty
                    ((QMakeProject *)CONCAT26(in_stack_fffffffffffff90e,in_stack_fffffffffffff908),
                     (ProKey *)in_stack_fffffffffffff900);
  ProKey::~ProKey((ProKey *)0x29210f);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    QString::operator+=((QString *)in_stack_fffffffffffff8f0,
                        (char *)CONCAT26(in_stack_fffffffffffff90e,in_stack_fffffffffffff908));
  }
  else {
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff8f0,(char *)in_stack_fffffffffffff8e8);
    QMakeEvaluator::first
              ((QMakeEvaluator *)CONCAT26(in_stack_fffffffffffff90e,in_stack_fffffffffffff908),
               (ProKey *)in_stack_fffffffffffff900);
    ::operator+((char (*) [2])in_stack_fffffffffffff8f8,(ProString *)in_stack_fffffffffffff8f0);
    ::operator+=((QString *)in_stack_fffffffffffff920,
                 (QStringBuilder<const_char_(&)[2],_ProString> *)
                 CONCAT26(in_stack_fffffffffffff91e,in_stack_fffffffffffff918));
    QStringBuilder<const_char_(&)[2],_ProString>::~QStringBuilder
              ((QStringBuilder<const_char_(&)[2],_ProString> *)0x2921a0);
    ProString::~ProString((ProString *)0x2921ad);
    ProKey::~ProKey((ProKey *)0x2921ba);
  }
  pVVar9 = (VcprojGenerator *)(in_RDI->super_Win32MakefileGenerator).super_MakefileGenerator.project
  ;
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff8f0,(char *)in_stack_fffffffffffff8e8);
  QMakeEvaluator::first
            ((QMakeEvaluator *)CONCAT26(in_stack_fffffffffffff90e,in_stack_fffffffffffff908),
             (ProKey *)in_stack_fffffffffffff900);
  bVar2 = ProString::isEmpty(local_3f0);
  (in_RDI->vcProject).Configuration.ATLMinimizesCRunTimeLibraryUsage = (uint)!bVar2;
  ProString::~ProString((ProString *)0x292266);
  ProKey::~ProKey((ProKey *)0x292273);
  bVar2 = ProString::isEmpty(local_e8);
  if (bVar2) {
    sVar4 = -1;
  }
  else {
    sVar4 = ProString::toShort(in_stack_fffffffffffff900,(bool *)in_stack_fffffffffffff8f8,
                               (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
  }
  (in_RDI->vcProject).Configuration.BuildBrowserInformation = (int)sVar4;
  this_02 = (VcprojGenerator *)
            (in_RDI->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff8f0,(char *)in_stack_fffffffffffff8e8);
  QMakeEvaluator::first
            ((QMakeEvaluator *)CONCAT26(in_stack_fffffffffffff90e,in_stack_fffffffffffff908),
             (ProKey *)in_stack_fffffffffffff900);
  ProString::operator=((ProString *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
  iVar8 = (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20);
  ProString::~ProString((ProString *)0x292323);
  ProKey::~ProKey((ProKey *)0x292330);
  bVar2 = ProString::isEmpty(local_e8);
  if (bVar2) {
    sVar4 = 0;
  }
  else {
    sVar4 = ProString::toShort(in_stack_fffffffffffff900,(bool *)in_stack_fffffffffffff8f8,iVar8);
  }
  (in_RDI->vcProject).Configuration.CharacterSet = (int)sVar4;
  this_00 = (in_RDI->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)this_00,(char *)in_stack_fffffffffffff8e8);
  QMakeEvaluator::first
            ((QMakeEvaluator *)CONCAT26(sVar4,in_stack_fffffffffffff908),
             (ProKey *)in_stack_fffffffffffff900);
  ProString::toQString(in_stack_fffffffffffff8e8);
  QString::operator=((QString *)this_00,&in_stack_fffffffffffff8e8->m_string);
  QString::~QString((QString *)0x2923f7);
  ProString::~ProString((ProString *)0x292404);
  ProKey::~ProKey((ProKey *)0x292411);
  QString::operator=(&(in_RDI->vcProject).Configuration.ImportLibrary,
                     (QString *)&(in_RDI->vcProject).Configuration.linker.ImportLibrary);
  ok = (in_RDI->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)this_00,(char *)in_stack_fffffffffffff8e8);
  QMakeEvaluator::first
            ((QMakeEvaluator *)CONCAT26(sVar4,in_stack_fffffffffffff908),
             (ProKey *)in_stack_fffffffffffff900);
  ProString::toQString(in_stack_fffffffffffff8e8);
  QString::operator=((QString *)this_00,&in_stack_fffffffffffff8e8->m_string);
  QString::~QString((QString *)0x2924b5);
  ProString::~ProString((ProString *)0x2924c2);
  ProKey::~ProKey((ProKey *)0x2924cf);
  (in_RDI->vcProject).Configuration.WholeProgramOptimization =
       (in_RDI->vcProject).Configuration.compiler.WholeProgramOptimization;
  this_01 = (VcprojGenerator *)
            (in_RDI->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)this_00,(char *)in_stack_fffffffffffff8e8);
  QMakeEvaluator::first
            ((QMakeEvaluator *)CONCAT26(sVar4,in_stack_fffffffffffff908),(ProKey *)this_01);
  ProString::operator=((ProString *)this_00,in_stack_fffffffffffff8e8);
  ProString::~ProString((ProString *)0x29254f);
  ProKey::~ProKey((ProKey *)0x29255c);
  bVar2 = ProString::isEmpty(local_e8);
  if (!bVar2) {
    sVar5 = ProString::toShort((ProString *)this_01,(bool *)ok,(int)((ulong)this_00 >> 0x20));
    (in_RDI->vcProject).Configuration.UseOfATL = (int)sVar5;
  }
  str = (in_RDI->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)this_00,(char *)str);
  QMakeEvaluator::first
            ((QMakeEvaluator *)CONCAT26(sVar4,in_stack_fffffffffffff908),(ProKey *)this_01);
  ProString::operator=((ProString *)this_00,(ProString *)str);
  iVar8 = (int)((ulong)this_00 >> 0x20);
  ProString::~ProString((ProString *)0x2925f6);
  ProKey::~ProKey((ProKey *)0x292603);
  bVar2 = ProString::isEmpty(local_e8);
  if (!bVar2) {
    sVar4 = ProString::toShort((ProString *)this_01,(bool *)ok,iVar8);
    (in_RDI->vcProject).Configuration.UseOfMfc = (int)sVar4;
  }
  initCustomBuildTool(in_RDI);
  initPreBuildEventTools(in_RDI);
  initPostBuildEventTools(this_02);
  bVar2 = QMakeEvaluator::isHostBuild
                    (&((in_RDI->super_Win32MakefileGenerator).super_MakefileGenerator.project)->
                      super_QMakeEvaluator);
  if (!bVar2) {
    initDeploymentTool(in_stack_fffffffffffffa40);
  }
  initWinDeployQtTool(pVVar9);
  initPreLinkEventTools(this_01);
  ProString::~ProString((ProString *)0x2926ae);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initConfiguration()
{
    // Initialize XML sub elements
    // - Do this first since main configuration elements may need
    // - to know of certain compiler/linker options
    VCConfiguration &conf = vcProject.Configuration;
    conf.suppressUnknownOptionWarnings = project->isActiveConfig("suppress_vcproj_warnings");
    conf.CompilerVersion = vsVersionFromString(project->first("MSVC_VER"));

    initCompilerTool();

    // Only on configuration per build
    bool isDebug = project->isActiveConfig("debug");

    if(projectTarget == StaticLib)
        initLibrarianTool();
    else {
        conf.linker.GenerateDebugInformation = project->isActiveConfig("debug_info") ? _True : _False;
        initLinkerTool();
    }
    initManifestTool();
    initResourceTool();
    initIDLTool();

    // Own elements -----------------------------
    ProString temp = project->first("BuildBrowserInformation");
    switch (projectTarget) {
    case SharedLib:
        conf.ConfigurationType = typeDynamicLibrary;
        break;
    case StaticLib:
        conf.ConfigurationType = typeStaticLibrary;
        break;
    case Application:
    default:
        conf.ConfigurationType = typeApplication;
        break;
    }

    conf.OutputDirectory = project->first("DESTDIR").toQString();
    if (conf.OutputDirectory.isEmpty())
        conf.OutputDirectory = ".\\";
    if (!conf.OutputDirectory.endsWith("\\"))
        conf.OutputDirectory += '\\';
    if (conf.CompilerVersion >= NET2010) {
        conf.PlatformToolSet = retrievePlatformToolSet();

        const QFileInfo targetInfo = fileInfo(project->first("MSVCPROJ_TARGET").toQString());
        conf.PrimaryOutput = targetInfo.completeBaseName();

        const QString targetSuffix = targetInfo.suffix();
        if (!isStandardSuffix(targetSuffix))
            conf.PrimaryOutputExtension = '.' + targetSuffix;
    }

    conf.Name = project->values("BUILD_NAME").join(' ');
    if (conf.Name.isEmpty())
        conf.Name = isDebug ? "Debug" : "Release";
    conf.ConfigurationName = conf.Name;
    if (!project->isEmpty("VCPROJ_ARCH")) {
        conf.Name += "|" + project->first("VCPROJ_ARCH");
    } else {
        conf.Name += (is64Bit ? "|x64" : "|Win32");
    }
    conf.ATLMinimizesCRunTimeLibraryUsage = (project->first("ATLMinimizesCRunTimeLibraryUsage").isEmpty() ? _False : _True);
    conf.BuildBrowserInformation = triState(temp.isEmpty() ? (short)unset : temp.toShort());
    temp = project->first("CharacterSet");
    conf.CharacterSet = charSet(temp.isEmpty() ? short(charSetNotSet) : temp.toShort());
    conf.DeleteExtensionsOnClean = project->first("DeleteExtensionsOnClean").toQString();
    conf.ImportLibrary = conf.linker.ImportLibrary;
    conf.IntermediateDirectory = project->first("OBJECTS_DIR").toQString();
    conf.WholeProgramOptimization = conf.compiler.WholeProgramOptimization;
    temp = project->first("UseOfATL");
    if(!temp.isEmpty())
        conf.UseOfATL = useOfATL(temp.toShort());
    temp = project->first("UseOfMfc");
    if(!temp.isEmpty())
        conf.UseOfMfc = useOfMfc(temp.toShort());

    // Configuration does not need parameters from
    // these sub XML items;
    initCustomBuildTool();
    initPreBuildEventTools();
    initPostBuildEventTools();
    // Only deploy for crosscompiled projects
    if (!project->isHostBuild())
        initDeploymentTool();
    initWinDeployQtTool();
    initPreLinkEventTools();
}